

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O0

HPDF_STATUS HPDF_CMapEncoder_AddCMap(HPDF_Encoder encoder,HPDF_CidRange_Rec *range)

{
  void *pvVar1;
  HPDF_UNICODE *item;
  HPDF_STATUS HVar2;
  bool bVar3;
  HPDF_UNICODE local_3c;
  ushort local_3a;
  HPDF_BYTE h;
  HPDF_BYTE l;
  HPDF_UINT16 cid;
  HPDF_UINT16 code;
  HPDF_STATUS ret;
  HPDF_CidRange_Rec *prange;
  HPDF_CMapEncoderAttr attr;
  HPDF_CidRange_Rec *range_local;
  HPDF_Encoder encoder_local;
  
  pvVar1 = encoder->attr;
  attr = (HPDF_CMapEncoderAttr)range;
  while( true ) {
    bVar3 = true;
    if (attr->unicode_map[0][0] == 0xffff) {
      bVar3 = attr->unicode_map[0][1] != 0xffff;
    }
    if (!bVar3) {
      return 0;
    }
    if (encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) {
      local_3c = attr->unicode_map[0][2];
      for (local_3a = attr->unicode_map[0][0]; local_3a <= attr->unicode_map[0][1];
          local_3a = local_3a + 1) {
        *(HPDF_UNICODE *)
         ((long)pvVar1 + (ulong)(byte)(local_3a >> 8) * 2 + (ulong)(byte)local_3a * 0x200 + 0x20000)
             = local_3c;
        local_3c = local_3c + 1;
      }
    }
    item = (HPDF_UNICODE *)HPDF_GetMem(encoder->mmgr,6);
    if (item == (HPDF_UNICODE *)0x0) break;
    *item = attr->unicode_map[0][0];
    item[1] = attr->unicode_map[0][1];
    item[2] = attr->unicode_map[0][2];
    HVar2 = HPDF_List_Add(*(HPDF_List *)((long)pvVar1 + 0x40100),item);
    if (HVar2 != 0) {
      HPDF_FreeMem(encoder->mmgr,item);
      return HVar2;
    }
    attr = (HPDF_CMapEncoderAttr)(attr->unicode_map[0] + 3);
  }
  return encoder->error->error_no;
}

Assistant:

HPDF_STATUS
HPDF_CMapEncoder_AddCMap  (HPDF_Encoder             encoder,
                           const HPDF_CidRange_Rec  *range)
{
    HPDF_CMapEncoderAttr attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_PTRACE ((" HPDF_CMapEncoder_AddCMap\n"));

    /* Copy specified pdf_cid_range array to fRangeArray. */
    while (range->from != 0xffff || range->to != 0xffff) {
        HPDF_CidRange_Rec *prange;
        HPDF_STATUS ret;

        /*
         * Only if we have the default to_unicode_fn
         */
        if (encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) {
            HPDF_UINT16 code = range->from;
            HPDF_UINT16 cid = range->cid;

            while (code <= range->to) {
                HPDF_BYTE l = (HPDF_BYTE)code;
                HPDF_BYTE h = code >> 8;

                attr->cid_map[l][h] = cid;
                code++;
                cid++;
            }
        }

        prange = HPDF_GetMem (encoder->mmgr, sizeof(HPDF_CidRange_Rec));
        if (!prange)
            return encoder->error->error_no;

        prange->from = range->from;
        prange->to = range->to;
        prange->cid = range->cid;

        if ((ret = HPDF_List_Add (attr->cmap_range, prange)) != HPDF_OK) {
            HPDF_FreeMem (encoder->mmgr, prange);
            return ret;
        }

        range++;
    }

    return HPDF_OK;
}